

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O2

QSQLiteDriverPrivate * __thiscall
QSQLiteDriverPrivate::getTableInfo
          (QSQLiteDriverPrivate *this,QSqlQuery *query,QString *tableName,bool onlyPIndex)

{
  long lVar1;
  char16_t *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  Data *pDVar8;
  qsizetype qVar9;
  undefined7 in_register_00000009;
  int iVar10;
  QSQLiteDriverPrivate *this_00;
  byte in_R8B;
  storage_type *psVar11;
  Data *pDVar12;
  long in_FS_OFFSET;
  QStringView identifier;
  QStringView identifier_00;
  QMetaType local_138;
  QArrayDataPointer<char16_t> local_130;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  undefined1 local_d8 [16];
  undefined1 *local_c8;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_98;
  QSqlField fld;
  storage_type *psStack_70;
  QString *local_68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_b8.size = 0;
  local_b8.d = (Data *)0x0;
  local_b8.ptr = (char16_t *)0x0;
  this_00 = (QSQLiteDriverPrivate *)local_d8;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_d8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  (**(code **)(**(long **)(query + 8) + 0xa0))
            (this_00,*(long **)(query + 8),(QString *)CONCAT71(in_register_00000009,onlyPIndex),1);
  pDVar8 = (Data *)QString::indexOf((QString *)this_00,(QChar)0x2e,0,CaseSensitive);
  if (-1 < (long)pDVar8) {
    local_118.ptr = (char16_t *)local_d8._8_8_;
    pDVar12 = (Data *)(local_c8 +
                      -(long)((long)&(pDVar8->super_QArrayData).ref_._q_value.
                                     super___atomic_base<int>._M_i + 1));
    psVar11 = (storage_type *)
              (local_d8._8_8_ +
              (undefined1 *)
              ((long)&(pDVar8->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1) *
              2);
    identifier.m_data = (storage_type *)local_d8._8_8_;
    identifier.m_size = (qsizetype)pDVar8;
    local_130.d = pDVar12;
    local_130.ptr = psVar11;
    local_118.d = pDVar8;
    bVar4 = isIdentifierEscaped(this_00,identifier);
    if (bVar4) {
      identifier_00.m_data = psVar11;
      identifier_00.m_size = (qsizetype)pDVar12;
      bVar4 = isIdentifierEscaped(this_00,identifier_00);
      if (bVar4) {
        QStringView::toString((QString *)&local_f8,(QStringView *)&local_118);
        qVar9 = local_f8.size;
        pcVar2 = local_f8.ptr;
        _fld = local_f8.d;
        local_f8.d = (Data *)0x0;
        local_f8.ptr = (storage_type *)0x0;
        local_f8.size = 0;
        QStringBuilder<QString,_char16_t>::convertTo<QString>
                  ((QString *)&local_98,(QStringBuilder<QString,_char16_t> *)&fld);
        local_b8.ptr = local_98.ptr;
        local_b8.d = local_98.d;
        local_98.d = (Data *)0x0;
        local_98.ptr = (char16_t *)0x0;
        local_b8.size = local_98.size;
        local_98.size = 0;
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fld);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
        QStringView::toString((QString *)&fld,(QStringView *)&local_130);
        uVar3 = local_d8._0_8_;
        local_d8._0_8_ = _fld;
        local_d8._8_8_ = pcVar2;
        _fld = (Data *)uVar3;
        local_c8 = (undefined1 *)qVar9;
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fld);
      }
    }
  }
  _fld = (Data *)0x7;
  QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QString_&>,_char16_t>
  ::convertTo<QString>
            ((QString *)&local_98,
             (QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QString_&>,_char16_t>
              *)&fld);
  QSqlQuery::exec(tableName);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x40 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x48 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x30 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x38 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x20 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x28 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x10 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&this->super_QSqlDriverPrivate = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&(this->super_QSqlDriverPrivate).field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  _fld = (Data *)0x0;
  psStack_70 = (storage_type *)0x0;
  local_68 = (QString *)0x0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  QSqlIndex::QSqlIndex((QSqlIndex *)this,(QString *)&fld,(QString *)&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fld);
  while( true ) {
    cVar5 = QSqlQuery::next();
    if (cVar5 == '\0') break;
    iVar7 = (int)(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QString_&>,_char16_t>
                  *)&fld;
    QSqlQuery::value(iVar7);
    iVar6 = QVariant::toInt((bool *)&fld);
    QVariant::~QVariant((QVariant *)&fld);
    if ((in_R8B & iVar6 == 0) == 0) {
      local_f8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_f8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QSqlQuery::value(iVar7);
      QVariant::toString();
      QString::toLower_helper((QString *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
      QVariant::~QVariant((QVariant *)&fld);
      local_118.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_118.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_118.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      QSqlQuery::value(iVar7);
      QVariant::toString();
      QVariant::~QVariant((QVariant *)&fld);
      if (((QString *)local_118.size != (QString *)0x0) && (*local_118.ptr == L'\'')) {
        qVar9 = QString::lastIndexOf((QString *)&local_118,(QChar)0x27,CaseSensitive);
        if (0 < (int)qVar9) {
          QString::mid((longlong)&fld,(longlong)&local_118);
          pDVar8 = local_118.d;
          local_118.d = _fld;
          local_118.ptr = psStack_70;
          _fld = pDVar8;
          local_118.size = (qsizetype)local_68;
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&fld);
        }
      }
      local_68 = (QString *)&DAT_aaaaaaaaaaaaaaaa;
      _fld = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      psStack_70 = (storage_type *)&DAT_aaaaaaaaaaaaaaaa;
      iVar10 = (int)&local_98;
      QSqlQuery::value(iVar10);
      QVariant::toString();
      iVar7 = qGetColumnType((QString *)&local_f8);
      QMetaType::QMetaType(&local_138,iVar7);
      QSqlField::QSqlField
                (&fld,(QString *)&local_130,local_138,
                 (QString *)CONCAT71(in_register_00000009,onlyPIndex));
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_130);
      QVariant::~QVariant((QVariant *)&local_98);
      if (iVar6 != 0) {
        local_98.d = (Data *)0x7;
        local_98.ptr = L"integer";
        bVar4 = operator==((QString *)&local_f8,(QLatin1StringView *)&local_98);
        if (bVar4) {
          QSqlField::setAutoValue
                    (SUB81((QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QLatin1String,_QString_&>,_QLatin1String>,_QString_&>,_char16_t>
                            *)&fld,0));
        }
      }
      QSqlQuery::value(iVar10);
      iVar6 = QVariant::toInt((bool *)&local_98);
      QSqlField::setRequired(&fld,iVar6 != 0);
      QVariant::~QVariant((QVariant *)&local_98);
      QVariant::QVariant((QVariant *)&local_98,(QString *)&local_118);
      QSqlField::setDefaultValue((QVariant *)&fld);
      QVariant::~QVariant((QVariant *)&local_98);
      QSqlIndex::append((QSqlField *)this);
      QSqlField::~QSqlField(&fld);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QSqlIndex QSQLiteDriverPrivate::getTableInfo(QSqlQuery &query, const QString &tableName,
                                             bool onlyPIndex) const
{
    Q_Q(const QSQLiteDriver);
    QString schema;
    QString table = q->escapeIdentifier(tableName, QSqlDriver::TableName);
    const auto indexOfSeparator = table.indexOf(u'.');
    if (indexOfSeparator > -1) {
        auto leftName = QStringView{table}.first(indexOfSeparator);
        auto rightName = QStringView{table}.sliced(indexOfSeparator + 1);
        if (isIdentifierEscaped(leftName) && isIdentifierEscaped(rightName)) {
            schema = leftName.toString() + u'.';
            table = rightName.toString();
        }
    }

    query.exec("PRAGMA "_L1 + schema + "table_info ("_L1 + table + u')');
    QSqlIndex ind;
    while (query.next()) {
        bool isPk = query.value(5).toInt();
        if (onlyPIndex && !isPk)
            continue;
        QString typeName = query.value(2).toString().toLower();
        QString defVal = query.value(4).toString();
        if (!defVal.isEmpty() && defVal.at(0) == u'\'') {
            const int end = defVal.lastIndexOf(u'\'');
            if (end > 0)
                defVal = defVal.mid(1, end - 1);
        }

        QSqlField fld(query.value(1).toString(), QMetaType(qGetColumnType(typeName)), tableName);
        if (isPk && (typeName == "integer"_L1))
            // INTEGER PRIMARY KEY fields are auto-generated in sqlite
            // INT PRIMARY KEY is not the same as INTEGER PRIMARY KEY!
            fld.setAutoValue(true);
        fld.setRequired(query.value(3).toInt() != 0);
        fld.setDefaultValue(defVal);
        ind.append(fld);
    }
    return ind;
}